

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp128.hpp
# Opt level: O2

uint duckdb::Chimp128Decompression<unsigned_int>::LoadFirst(DecompressState *state)

{
  uint uVar1;
  
  uVar1 = BitReader::ReadValue<unsigned_int,(unsigned_char)32>(&state->input);
  (state->ring_buffer).buffer[(uint)(state->ring_buffer).index & 0x7f] = (ulong)uVar1;
  state->first = false;
  state->reference_value = uVar1;
  return uVar1;
}

Assistant:

static inline CHIMP_TYPE LoadFirst(DecompressState &state) {
		CHIMP_TYPE result = state.input.template ReadValue<CHIMP_TYPE, sizeof(CHIMP_TYPE) * 8>();
		state.ring_buffer.template InsertScan<true>(result);
		state.first = false;
		state.reference_value = result;
		return result;
	}